

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O0

void __thiscall
icu_63::StringCharacterIterator::StringCharacterIterator
          (StringCharacterIterator *this,StringCharacterIterator *that)

{
  char16_t *pcVar1;
  StringCharacterIterator *that_local;
  StringCharacterIterator *this_local;
  
  UCharCharacterIterator::UCharCharacterIterator
            (&this->super_UCharCharacterIterator,&that->super_UCharCharacterIterator);
  (this->super_UCharCharacterIterator).super_CharacterIterator.super_ForwardCharacterIterator.
  super_UObject._vptr_UObject = (_func_int **)&PTR__StringCharacterIterator_004b0e90;
  UnicodeString::UnicodeString(&this->text,&that->text);
  pcVar1 = UnicodeString::getBuffer(&this->text);
  (this->super_UCharCharacterIterator).text = pcVar1;
  return;
}

Assistant:

StringCharacterIterator::StringCharacterIterator(const StringCharacterIterator& that)
  : UCharCharacterIterator(that),
    text(that.text)
{
    // we had set the input parameter's array, now we need to set our copy's array
    UCharCharacterIterator::text = this->text.getBuffer();
}